

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O3

Ivy_Obj_t * Ivy_And(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1)

{
  Ivy_Obj_t *pIVar1;
  int iVar2;
  int *piVar3;
  Ivy_Obj_t *pIVar4;
  int *piVar5;
  
  pIVar4 = p0;
  if (p0 != p1) {
    if ((Ivy_Obj_t *)((ulong)p1 ^ 1) == p0) {
      pIVar4 = (Ivy_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pIVar1 = p->pConst1;
      if (pIVar1 == (Ivy_Obj_t *)((ulong)p0 & 0xfffffffffffffffe)) {
        pIVar4 = p1;
        if ((Ivy_Obj_t *)((ulong)p0 & 0xfffffffffffffffe) != p0) {
          pIVar4 = (Ivy_Obj_t *)((ulong)p0 | 1);
        }
      }
      else {
        if (pIVar1 != (Ivy_Obj_t *)((ulong)p1 & 0xfffffffffffffffe)) {
          piVar3 = (int *)((ulong)p0 & 0xfffffffffffffffe);
          if (*piVar3 == 0) {
            __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x137,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
          if (p1 == (Ivy_Obj_t *)0x0) {
            piVar5 = (int *)0x0;
          }
          else {
            piVar5 = (int *)((ulong)p1 & 0xfffffffffffffffe);
            if (*piVar5 == 0) {
              __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                            ,0x138,
                            "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                           );
            }
          }
          if (piVar3 == piVar5) {
            __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x139,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
          *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
          (p->Ghost).pFanin0 = p0;
          (p->Ghost).pFanin1 = p1;
          if (p1 != (Ivy_Obj_t *)0x0) {
            if (p0 == (Ivy_Obj_t *)0x0) {
              iVar2 = 0;
            }
            else {
              iVar2 = *piVar3;
            }
            if (*piVar5 < iVar2) {
              (p->Ghost).pFanin0 = p1;
              (p->Ghost).pFanin1 = p0;
            }
          }
          pIVar4 = Ivy_CanonPair_rec(p,&p->Ghost);
          return pIVar4;
        }
        if (pIVar1 != p1) {
          pIVar4 = (Ivy_Obj_t *)((ulong)pIVar1 ^ 1);
        }
      }
    }
  }
  return pIVar4;
}

Assistant:

Ivy_Obj_t * Ivy_And( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1 )
{
//    Ivy_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Ivy_Not(p->pConst1);
    // check if it can be an EXOR gate
//    if ( Ivy_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
//        return Ivy_CanonExor( pFan0, pFan1 );
    return Ivy_CanonAnd( p, p0, p1 );
}